

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O3

int Abc_NtkRetimeMinDelayTry
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fInitial,int nIterLimit,int *pIterBest
              ,int fVerbose)

{
  undefined4 uVar1;
  long *plVar2;
  long *plVar3;
  Abc_Obj_t *pObj;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint *__ptr;
  void *pvVar9;
  int *piVar10;
  uint *__ptr_00;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  char *pcVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  uint uVar14;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar15;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  ulong local_c8;
  uint local_c0;
  uint local_bc;
  int local_a0;
  uint local_98;
  ulong local_88;
  Vec_Int_t *local_80;
  Abc_Ntk_t *local_68;
  ulong local_60;
  
  if (fInitial == 0) {
    if (fVerbose == 0) goto LAB_008e4bfe;
    puts("Performing analysis:");
    bVar5 = false;
  }
  else {
    if (fForward == 0) {
      local_80 = Abc_NtkRetimeCollectLatchValues(pNtk);
      local_68 = Abc_NtkRetimeBackwardInitialStart(pNtk);
      bVar5 = true;
      goto LAB_008e4c37;
    }
    Abc_NtkRetimeTranferToCopy(pNtk);
LAB_008e4bfe:
    bVar5 = true;
  }
  local_68 = (Abc_Ntk_t *)0x0;
  local_80 = (Vec_Int_t *)0x0;
LAB_008e4c37:
  local_a0 = pNtk->nObjCounts[8];
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar9 = malloc(800);
  *(void **)(__ptr + 2) = pvVar9;
  pcVar13 = "Fwd";
  if (fForward == 0) {
    pcVar13 = "Bwd";
  }
  local_98 = 0xffffffff;
  local_bc = 1000000000;
  uVar17 = 0;
  local_88 = 100;
  local_60 = 100;
  local_c0 = 0;
  do {
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar8 = pNtk->vObjs->nSize;
      uVar19 = (long)iVar8 + 500;
      iVar7 = (int)uVar19;
      if ((pNtk->vTravIds).nCap < iVar7) {
        piVar10 = (int *)malloc(uVar19 * 4);
        (pNtk->vTravIds).pArray = piVar10;
        if (piVar10 == (int *)0x0) goto LAB_008e5731;
        (pNtk->vTravIds).nCap = iVar7;
      }
      else {
        piVar10 = (int *)0x0;
      }
      if (-500 < iVar8) {
        memset(piVar10,0,(uVar19 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar7;
    }
    iVar8 = pNtk->nTravIds;
    pNtk->nTravIds = iVar8 + 1;
    if (0x3ffffffe < iVar8) goto LAB_008e5712;
    uVar6 = pNtk->nObjCounts[8];
    __ptr_00 = (uint *)malloc(0x10);
    if (uVar6 - 1 < 7) {
      uVar6 = 8;
    }
    uVar19 = (ulong)uVar6;
    __ptr_00[1] = 0;
    *__ptr_00 = uVar6;
    if (uVar6 == 0) {
      pvVar9 = (void *)0x0;
      uVar15 = extraout_RDX;
    }
    else {
      pvVar9 = malloc((long)(int)uVar6 << 3);
      uVar15 = extraout_RDX_00;
    }
    *(void **)(__ptr_00 + 2) = pvVar9;
    pVVar11 = pNtk->vObjs;
    if (pVVar11->nSize < 1) {
      local_c8 = 0;
      uVar6 = 0;
      if (fForward != 0) goto LAB_008e4fd2;
LAB_008e5053:
      pVVar11 = pNtk->vPos;
      bVar4 = true;
      if (0 < pVVar11->nSize) {
        lVar18 = 0;
        uVar12 = uVar6;
        do {
          uVar6 = Abc_NtkRetimeTiming_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*pVVar11->pArray[lVar18] + 0x20) + 8) +
                              (long)**(int **)((long)pVVar11->pArray[lVar18] + 0x20) * 8),0);
          if ((int)uVar6 < (int)uVar12) {
            uVar6 = uVar12;
          }
          lVar18 = lVar18 + 1;
          pVVar11 = pNtk->vPos;
          uVar15 = extraout_RDX_05;
          uVar12 = uVar6;
        } while (lVar18 < pVVar11->nSize);
      }
    }
    else {
      local_c8 = 0;
      lVar18 = 0;
      do {
        plVar2 = (long *)pVVar11->pArray[lVar18];
        if (plVar2 != (long *)0x0) {
          uVar6 = *(uint *)((long)plVar2 + 0x14);
          uVar12 = uVar6 & 0xf;
          if (uVar12 == 8) {
            iVar8 = (int)uVar19;
            if ((int)local_c8 == iVar8) {
              if (iVar8 < 0x10) {
                if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                  pvVar9 = malloc(0x80);
                }
                else {
                  pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
                }
                *(void **)(__ptr_00 + 2) = pvVar9;
                *__ptr_00 = 0x10;
                uVar19 = 0x10;
              }
              else {
                uVar19 = (ulong)(uint)(iVar8 * 2);
                if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                  pvVar9 = malloc(uVar19 * 8);
                }
                else {
                  pvVar9 = realloc(*(void **)(__ptr_00 + 2),uVar19 * 8);
                }
                *(void **)(__ptr_00 + 2) = pvVar9;
                *__ptr_00 = iVar8 * 2;
              }
            }
            else {
              pvVar9 = *(void **)(__ptr_00 + 2);
            }
            uVar15 = (ulong)((int)local_c8 + 1U);
            __ptr_00[1] = (int)local_c8 + 1U;
            *(long **)((long)pvVar9 + (long)(int)local_c8 * 8) = plVar2;
            uVar6 = *(uint *)((long)plVar2 + 0x14);
            uVar12 = uVar6 & 0xf;
            local_c8 = uVar15;
          }
          if (uVar12 != 7) {
            *(uint *)((long)plVar2 + 0x14) = uVar6 & 0xfff;
            lVar16 = *plVar2;
            iVar8 = (int)plVar2[2];
            uVar1 = *(undefined4 *)(lVar16 + 0xd8);
            Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar8 + 1,(int)uVar15);
            if (((long)iVar8 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar8)) {
LAB_008e56f3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(undefined4 *)(*(long *)(lVar16 + 0xe8) + (long)iVar8 * 4) = uVar1;
            uVar15 = extraout_RDX_01;
          }
        }
        lVar18 = lVar18 + 1;
        pVVar11 = pNtk->vObjs;
      } while (lVar18 < pVVar11->nSize);
      if (fForward == 0) {
        if ((int)local_c8 < 1) {
          uVar6 = 0;
        }
        else {
          lVar18 = *(long *)(__ptr_00 + 2);
          uVar19 = 0;
          uVar12 = 0;
          do {
            plVar2 = *(long **)(lVar18 + uVar19 * 8);
            uVar6 = Abc_NtkRetimeTiming_rec
                              (*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[4] * 8),0);
            if ((int)uVar6 < (int)uVar12) {
              uVar6 = uVar12;
            }
            uVar19 = uVar19 + 1;
            uVar15 = extraout_RDX_03;
            uVar12 = uVar6;
          } while (local_c8 != uVar19);
        }
        goto LAB_008e5053;
      }
      if ((int)local_c8 < 1) {
        uVar6 = 0;
      }
      else {
        lVar18 = *(long *)(__ptr_00 + 2);
        uVar19 = 0;
        uVar6 = 0;
        do {
          plVar2 = *(long **)(lVar18 + uVar19 * 8);
          if (0 < *(int *)((long)plVar2 + 0x2c)) {
            lVar16 = 0;
            do {
              uVar12 = Abc_NtkRetimeTiming_rec
                                 (*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)(plVar2[6] + lVar16 * 4) * 8),fForward);
              if ((int)uVar6 <= (int)uVar12) {
                uVar6 = uVar12;
              }
              lVar16 = lVar16 + 1;
              uVar15 = extraout_RDX_02;
            } while (lVar16 < *(int *)((long)plVar2 + 0x2c));
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != local_c8);
      }
LAB_008e4fd2:
      pVVar11 = pNtk->vPis;
      if (0 < pVVar11->nSize) {
        lVar18 = 0;
        do {
          plVar2 = (long *)pVVar11->pArray[lVar18];
          if (0 < *(int *)((long)plVar2 + 0x2c)) {
            lVar16 = 0;
            do {
              uVar12 = Abc_NtkRetimeTiming_rec
                                 (*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)(plVar2[6] + lVar16 * 4) * 8),fForward);
              if ((int)uVar12 < (int)uVar6) {
                uVar12 = uVar6;
              }
              uVar6 = uVar12;
              lVar16 = lVar16 + 1;
            } while (lVar16 < *(int *)((long)plVar2 + 0x2c));
            pVVar11 = pNtk->vPis;
            uVar15 = extraout_RDX_04;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar11->nSize);
      }
      bVar4 = false;
    }
    __ptr[1] = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar8 = pNtk->vObjs->nSize;
      uVar19 = (long)iVar8 + 500;
      iVar7 = (int)uVar19;
      if ((pNtk->vTravIds).nCap < iVar7) {
        piVar10 = (int *)malloc(uVar19 * 4);
        (pNtk->vTravIds).pArray = piVar10;
        if (piVar10 == (int *)0x0) {
LAB_008e5731:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar7;
        uVar15 = extraout_RDX_06;
      }
      else {
        piVar10 = (int *)0x0;
      }
      if (-500 < iVar8) {
        memset(piVar10,0,(uVar19 & 0xffffffff) << 2);
        uVar15 = extraout_RDX_07;
      }
      (pNtk->vTravIds).nSize = iVar7;
    }
    iVar8 = pNtk->nTravIds;
    pNtk->nTravIds = iVar8 + 1;
    if (0x3ffffffe < iVar8) {
LAB_008e5712:
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    if (bVar4) {
      if ((int)local_c8 < 1) {
LAB_008e54c2:
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        uVar19 = 0;
        do {
          plVar2 = *(long **)(*(long *)(__ptr_00 + 2) + uVar19 * 8);
          if (0 < *(int *)((long)plVar2 + 0x1c)) {
            lVar18 = 0;
            do {
              plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)(plVar2[4] + lVar18 * 4) * 8);
              lVar16 = *plVar3;
              iVar8 = (int)plVar3[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar8 + 1,(int)uVar15);
              iVar7 = (int)extraout_RDX_08;
              if (((long)iVar8 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar8)) {
LAB_008e56d4:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar15 = extraout_RDX_08;
              if ((*(int *)(*(long *)(lVar16 + 0xe8) + (long)iVar8 * 4) != *(int *)(*plVar3 + 0xd8))
                 && (uVar6 == *(uint *)((long)plVar3 + 0x14) >> 0xc)) {
                uVar14 = (uint)local_88;
                if (uVar12 == uVar14) {
                  if ((int)uVar14 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                      iVar7 = extraout_EDX_01;
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
                      iVar7 = extraout_EDX;
                    }
                    *(void **)(__ptr + 2) = pvVar9;
                    *__ptr = 0x10;
                    local_88 = 0x10;
                  }
                  else {
                    local_88 = (ulong)(uVar14 * 2);
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar9 = malloc(local_88 * 8);
                      iVar7 = extraout_EDX_02;
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr + 2),local_88 * 8);
                      iVar7 = extraout_EDX_00;
                    }
                    *(void **)(__ptr + 2) = pvVar9;
                    *__ptr = uVar14 * 2;
                  }
                }
                else {
                  pvVar9 = *(void **)(__ptr + 2);
                }
                __ptr[1] = uVar12 + 1;
                *(long **)((long)pvVar9 + (long)(int)uVar12 * 8) = plVar3;
                lVar16 = *plVar3;
                iVar8 = (int)plVar3[2];
                uVar1 = *(undefined4 *)(lVar16 + 0xd8);
                Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar8 + 1,iVar7);
                if (((long)iVar8 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar8)) goto LAB_008e56f3;
                *(undefined4 *)(*(long *)(lVar16 + 0xe8) + (long)iVar8 * 4) = uVar1;
                local_60 = local_88;
                uVar15 = extraout_RDX_09;
                uVar12 = uVar12 + 1;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar2 + 0x1c));
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != local_c8);
      }
    }
    else {
      if ((int)local_c8 < 1) goto LAB_008e54c2;
      uVar12 = 0;
      uVar19 = 0;
      do {
        plVar2 = *(long **)(*(long *)(__ptr_00 + 2) + uVar19 * 8);
        if (0 < *(int *)((long)plVar2 + 0x2c)) {
          lVar18 = 0;
          do {
            plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)(plVar2[6] + lVar18 * 4) * 8);
            lVar16 = *plVar3;
            iVar8 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar8 + 1,(int)uVar15);
            iVar7 = (int)extraout_RDX_10;
            if (((long)iVar8 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar8)) goto LAB_008e56d4;
            uVar15 = extraout_RDX_10;
            if ((*(int *)(*(long *)(lVar16 + 0xe8) + (long)iVar8 * 4) != *(int *)(*plVar3 + 0xd8))
               && (uVar6 == *(uint *)((long)plVar3 + 0x14) >> 0xc)) {
              uVar14 = (uint)local_60;
              if (uVar12 == uVar14) {
                if ((int)uVar14 < 0x10) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar9 = malloc(0x80);
                    iVar7 = extraout_EDX_05;
                  }
                  else {
                    pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
                    iVar7 = extraout_EDX_03;
                  }
                  *(void **)(__ptr + 2) = pvVar9;
                  *__ptr = 0x10;
                  local_88 = 0x10;
                  local_60 = 0x10;
                }
                else {
                  uVar14 = uVar14 * 2;
                  local_60 = (ulong)uVar14;
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar9 = malloc(local_60 * 8);
                    iVar7 = extraout_EDX_06;
                  }
                  else {
                    pvVar9 = realloc(*(void **)(__ptr + 2),local_60 * 8);
                    iVar7 = extraout_EDX_04;
                  }
                  *(void **)(__ptr + 2) = pvVar9;
                  *__ptr = uVar14;
                  local_88 = (ulong)uVar14;
                }
              }
              else {
                pvVar9 = *(void **)(__ptr + 2);
              }
              __ptr[1] = uVar12 + 1;
              *(long **)((long)pvVar9 + (long)(int)uVar12 * 8) = plVar3;
              lVar16 = *plVar3;
              iVar8 = (int)plVar3[2];
              uVar1 = *(undefined4 *)(lVar16 + 0xd8);
              Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar8 + 1,iVar7);
              if (((long)iVar8 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar8)) goto LAB_008e56f3;
              *(undefined4 *)(*(long *)(lVar16 + 0xe8) + (long)iVar8 * 4) = uVar1;
              uVar15 = extraout_RDX_11;
              uVar12 = uVar12 + 1;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < *(int *)((long)plVar2 + 0x2c));
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_c8);
    }
    if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 2));
    }
    free(__ptr_00);
    uVar14 = (uint)uVar17;
    if (uVar14 == 0) {
      local_98 = uVar6;
    }
    iVar7 = local_bc - uVar6;
    iVar8 = local_a0;
    if ((iVar7 != 0 && (int)uVar6 <= (int)local_bc) &&
       (iVar8 = pNtk->nObjCounts[8], local_c0 = uVar14, local_bc = uVar6, !bVar5)) {
      dVar20 = (double)iVar7;
      printf("%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n",
             (double)(iVar8 - local_a0) / dVar20,
             (((double)(iVar8 - local_a0) * 100.0) / (double)iVar8) / dVar20,pcVar13,uVar17,
             (ulong)uVar6);
      iVar8 = pNtk->nObjCounts[8];
    }
    local_a0 = iVar8;
    if (((uVar14 == nIterLimit) || (0x14 < (int)(uVar14 - local_c0))) ||
       (0 < nDelayLim && (int)uVar6 <= nDelayLim)) {
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
      if (fInitial != 0) {
        if (fForward == 0) {
          Abc_NtkRetimeBackwardInitialFinish(pNtk,local_68,local_80,fVerbose);
          Abc_NtkDelete(local_68);
          if (local_80->pArray != (int *)0x0) {
            free(local_80->pArray);
          }
          free(local_80);
        }
        else {
          Abc_NtkRetimeTranferFromCopy(pNtk);
        }
      }
      if (!bVar5) {
        pcVar13 = "Forward ";
        if (fForward == 0) {
          pcVar13 = "Backward";
        }
        printf("%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n",
               pcVar13,(ulong)local_98,(ulong)local_bc,(ulong)local_c0,(ulong)(uint)nIterLimit);
      }
      if (nIterLimit == 1) {
        local_c0 = 1;
      }
      *pIterBest = local_c0;
      return local_bc;
    }
    if (0 < (int)uVar12) {
      lVar18 = *(long *)(__ptr + 2);
      uVar17 = 0;
      do {
        pObj = *(Abc_Obj_t **)(lVar18 + uVar17 * 8);
        iVar8 = Abc_NtkRetimeNodeIsEnabled(pObj,fForward);
        if (iVar8 != 0) {
          Abc_NtkRetimeNode(pObj,fForward,fInitial);
        }
        uVar17 = uVar17 + 1;
      } while (uVar12 != uVar17);
    }
    if (fForward == 0) {
      Abc_NtkRetimeShareLatches(pNtk,fInitial);
    }
    uVar17 = (ulong)(uVar14 + 1);
  } while( true );
}

Assistant:

int Abc_NtkRetimeMinDelayTry( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fInitial, int nIterLimit, int * pIterBest, int fVerbose )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vCritical;
    Vec_Int_t * vValues = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pObj;
    int i, k, IterBest, DelayCur, DelayBest;
    int DelayStart = -1; // Suppress "might be used uninitialized"
    int LatchesBest;
    // transfer intitial values
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferToCopy( pNtk );
        else
        {
            // save initial value of the latches
            vValues = Abc_NtkRetimeCollectLatchValues( pNtk );
            // start the network for initial value computation
            pNtkNew = Abc_NtkRetimeBackwardInitialStart( pNtk );
        }
    }

    if ( fVerbose && !fInitial )
        printf( "Performing analysis:\n" );
    // find the best iteration
    DelayBest = ABC_INFINITY; IterBest = 0; LatchesBest = Abc_NtkLatchNum(pNtk);
    vCritical = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        // perform moves for the timing-critical nodes
        DelayCur = Abc_NtkRetimeTiming( pNtk, fForward, vCritical );
        if ( i == 0 )
            DelayStart = DelayCur;
        // record this position if it has the best delay
        if ( DelayBest > DelayCur )
        {
if ( fVerbose && !fInitial )
    printf( "%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n", 
        fForward ? "Fwd": "Bwd", i, DelayCur, Abc_NtkLatchNum(pNtk), 
        1.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/(DelayBest-DelayCur), 
        100.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/Abc_NtkLatchNum(pNtk)/(DelayBest-DelayCur) );

            DelayBest = DelayCur;
            IterBest = i;
            LatchesBest = Abc_NtkLatchNum(pNtk);
        }
        // quit after timing analysis
        if ( i == nIterLimit )
            break;
        // skip if 10 iterations did not give improvement
        if ( i - IterBest > 20 )
            break;
        // skip if delay limit is reached
        if ( nDelayLim > 0 && DelayCur <= nDelayLim )
            break;
        // try retiming to improve the delay
        Vec_PtrForEachEntry( Abc_Obj_t *, vCritical, pObj, k )
            if ( Abc_NtkRetimeNodeIsEnabled(pObj, fForward) )
                Abc_NtkRetimeNode( pObj, fForward, fInitial );
        // share latches
        if ( !fForward )
            Abc_NtkRetimeShareLatches( pNtk, fInitial );    
    }
    Vec_PtrFree( vCritical );
    // transfer the initial state back to the latches
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferFromCopy( pNtk );
        else
        {
            Abc_NtkRetimeBackwardInitialFinish( pNtk, pNtkNew, vValues, fVerbose );
            Abc_NtkDelete( pNtkNew );
            Vec_IntFree( vValues );
        }
    }
    if ( fVerbose && !fInitial )
        printf( "%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n",
            fForward? "Forward " : "Backward", DelayStart, DelayBest, IterBest, nIterLimit );
    *pIterBest = (nIterLimit == 1) ? 1 : IterBest;
    return DelayBest;
}